

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O3

uint32_t __thiscall
spvtools::opt::analysis::DebugInfoManager::GetParentScope
          (DebugInfoManager *this,uint32_t child_scope)

{
  CommonDebugInfoInstructions CVar1;
  uint32_t uVar2;
  iterator iVar3;
  uint32_t local_c;
  
  local_c = child_scope;
  iVar3 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->id_to_dbg_inst_)._M_h,&local_c);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>.
      _M_cur == (__node_type *)0x0) {
    __assert_fail("dbg_scope_itr != id_to_dbg_inst_.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp"
                  ,0x1e6,
                  "uint32_t spvtools::opt::analysis::DebugInfoManager::GetParentScope(uint32_t)");
  }
  CVar1 = Instruction::GetCommonDebugOpcode
                    (*(Instruction **)
                      ((long)iVar3.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
                             ._M_cur + 0x10));
  uVar2 = 9;
  if ((int)CVar1 < 0x14) {
    if (CVar1 == CommonDebugInfoDebugCompilationUnit) {
      return 0;
    }
    if (CVar1 != CommonDebugInfoDebugTypeComposite) {
LAB_005577f2:
      __assert_fail("false && \"Unreachable. A debug scope instruction must be \" \"DebugFunction, DebugTypeComposite, DebugLexicalBlock, \" \"or DebugCompilationUnit.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp"
                    ,0x1fe,
                    "uint32_t spvtools::opt::analysis::DebugInfoManager::GetParentScope(uint32_t)");
    }
  }
  else if (CVar1 != CommonDebugInfoDebugFunction) {
    if (CVar1 != CommonDebugInfoDebugLexicalBlock) goto LAB_005577f2;
    uVar2 = 7;
  }
  uVar2 = Instruction::GetSingleWordOperand
                    (*(Instruction **)
                      ((long)iVar3.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
                             ._M_cur + 0x10),uVar2);
  return uVar2;
}

Assistant:

uint32_t DebugInfoManager::GetParentScope(uint32_t child_scope) {
  auto dbg_scope_itr = id_to_dbg_inst_.find(child_scope);
  assert(dbg_scope_itr != id_to_dbg_inst_.end());
  CommonDebugInfoInstructions debug_opcode =
      dbg_scope_itr->second->GetCommonDebugOpcode();
  uint32_t parent_scope = kNoDebugScope;
  switch (debug_opcode) {
    case CommonDebugInfoDebugFunction:
      parent_scope = dbg_scope_itr->second->GetSingleWordOperand(
          kDebugFunctionOperandParentIndex);
      break;
    case CommonDebugInfoDebugLexicalBlock:
      parent_scope = dbg_scope_itr->second->GetSingleWordOperand(
          kDebugLexicalBlockOperandParentIndex);
      break;
    case CommonDebugInfoDebugTypeComposite:
      parent_scope = dbg_scope_itr->second->GetSingleWordOperand(
          kDebugTypeCompositeOperandParentIndex);
      break;
    case CommonDebugInfoDebugCompilationUnit:
      // DebugCompilationUnit does not have a parent scope.
      break;
    default:
      assert(false &&
             "Unreachable. A debug scope instruction must be "
             "DebugFunction, DebugTypeComposite, DebugLexicalBlock, "
             "or DebugCompilationUnit.");
      break;
  }
  return parent_scope;
}